

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeEventHostReset(ze_event_handle_t hEvent)

{
  ze_pfnEventHostReset_t pfnHostReset;
  ze_result_t result;
  ze_event_handle_t hEvent_local;
  
  pfnHostReset._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c5f8 != (code *)0x0) {
    pfnHostReset._4_4_ = (*DAT_0011c5f8)(hEvent);
  }
  return pfnHostReset._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventHostReset(
        ze_event_handle_t hEvent                        ///< [in] handle of the event
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnHostReset = context.zeDdiTable.Event.pfnHostReset;
        if( nullptr != pfnHostReset )
        {
            result = pfnHostReset( hEvent );
        }
        else
        {
            // generic implementation
        }

        return result;
    }